

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_convert.cpp
# Opt level: O0

string * Potassco::xconvert(string *out,long n)

{
  string *in_RDI;
  string *in_stack_ffffffffffffff88;
  StringBuilder *in_stack_ffffffffffffff90;
  StringBuilder *in_stack_ffffffffffffffa0;
  
  StringBuilder::StringBuilder(in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
  StringBuilder::append(in_stack_ffffffffffffff90,(long)in_stack_ffffffffffffff88);
  StringBuilder::~StringBuilder(in_stack_ffffffffffffffa0);
  return in_RDI;
}

Assistant:

string& xconvert(string& out, long n) { return (StringBuilder(out).append(n), out); }